

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPDUHandler.cpp
# Opt level: O0

bool handleSetRequestPDU(deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,
                        deque<VarBind,_std::allocator<VarBind>_> *varbindList,
                        deque<VarBind,_std::allocator<VarBind>_> *outResponseList,
                        SNMP_VERSION snmpVersion)

{
  bool bVar1;
  element_type *oid;
  SNMP_ERROR_STATUS local_124;
  SNMP_ERROR_STATUS local_f8;
  ERROR_STATUS_WITH_VALUE local_e0;
  ERROR_STATUS_WITH_VALUE local_ac;
  undefined1 local_a8 [8];
  shared_ptr<BER_CONTAINER> value;
  ERROR_STATUS_WITH_VALUE local_8c;
  SNMP_ERROR_STATUS setError;
  ERROR_STATUS_WITH_VALUE local_84;
  ValueCallback *local_80;
  ValueCallback *callback;
  VarBind *requestVarBind;
  iterator __end1;
  iterator __begin1;
  deque<VarBind,_std::allocator<VarBind>_> *__range1;
  SNMP_VERSION snmpVersion_local;
  deque<VarBind,_std::allocator<VarBind>_> *outResponseList_local;
  deque<VarBind,_std::allocator<VarBind>_> *varbindList_local;
  deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks_local;
  
  std::deque<VarBind,_std::allocator<VarBind>_>::begin((iterator *)&__end1._M_node,varbindList);
  std::deque<VarBind,_std::allocator<VarBind>_>::end((iterator *)&requestVarBind,varbindList);
  while (bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&requestVarBind), bVar1) {
    callback = (ValueCallback *)
               std::_Deque_iterator<VarBind,_VarBind_&,_VarBind_*>::operator*
                         ((_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)&__end1._M_node);
    oid = std::__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>::get
                    ((__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> *)callback);
    local_80 = ValueCallback::findCallback(callbacks,oid,false,0,(size_t *)0x0);
    if (local_80 == (ValueCallback *)0x0) {
      if (snmpVersion == SNMP_VERSION_1) {
        local_e0 = NO_SUCH_NAME;
      }
      else {
        local_e0 = NOT_WRITABLE;
      }
      local_84 = local_e0;
      std::deque<VarBind,std::allocator<VarBind>>::
      emplace_back<std::shared_ptr<OIDType>const&,ERROR_STATUS_WITH_VALUE>
                ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,
                 (shared_ptr<OIDType> *)callback,&local_84);
    }
    else if (local_80->type == callback->type) {
      if ((local_80->isSettable & 1U) == 0) {
        local_8c = READ_ONLY;
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<std::shared_ptr<OIDType>const&,ERROR_STATUS_WITH_VALUE>
                  ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,
                   (shared_ptr<OIDType> *)callback,&local_8c);
      }
      else {
        local_124 = ValueCallback::setValueForCallback
                              (local_80,(shared_ptr<BER_CONTAINER> *)(callback + 1));
        if (local_124 == NO_ERROR) {
          ValueCallback::getValueForCallback((ValueCallback *)local_a8,local_80);
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a8);
          if (bVar1) {
            std::deque<VarBind,std::allocator<VarBind>>::
            emplace_back<SortableOIDType*const&,std::shared_ptr<BER_CONTAINER>&>
                      ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&local_80->OID,
                       (shared_ptr<BER_CONTAINER> *)local_a8);
          }
          else {
            local_ac = GEN_ERR;
            std::deque<VarBind,std::allocator<VarBind>>::
            emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                      ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&local_80->OID,
                       &local_ac);
          }
          std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_a8);
        }
        else {
          if ((snmpVersion == SNMP_VERSION_1) && (5 < (int)local_124)) {
            local_124 = GEN_ERR;
          }
          value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = local_124;
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                    ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&local_80->OID,
                     (ERROR_STATUS_WITH_VALUE *)
                     ((long)&value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4));
        }
      }
    }
    else {
      if (snmpVersion == SNMP_VERSION_1) {
        local_f8 = BAD_VALUE;
      }
      else {
        local_f8 = WRONG_TYPE;
      }
      setError = local_f8;
      std::deque<VarBind,std::allocator<VarBind>>::
      emplace_back<std::shared_ptr<OIDType>const&,ERROR_STATUS_WITH_VALUE>
                ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,
                 (shared_ptr<OIDType> *)callback,&setError);
    }
    std::_Deque_iterator<VarBind,_VarBind_&,_VarBind_*>::operator++
              ((_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)&__end1._M_node);
  }
  return true;
}

Assistant:

bool handleSetRequestPDU(std::deque<ValueCallback*> &callbacks, std::deque<VarBind> &varbindList, std::deque<VarBind> &outResponseList, SNMP_VERSION snmpVersion){
    SNMP_LOGD("handleSetRequestPDU\n");
    for(const VarBind& requestVarBind : varbindList){
        SNMP_LOGD("finding callback for OID: %s\n", requestVarBind.oid->string().c_str());
        ValueCallback* callback = ValueCallback::findCallback(callbacks, requestVarBind.oid.get(), false);
        if(!callback){
            SNMP_LOGD("Couldn't find callback\n");
            outResponseList.emplace_back(requestVarBind.oid, SNMP_ERROR_VERSION_CTRL_DEF(NOT_WRITABLE, snmpVersion, NO_SUCH_NAME));
            continue;
        }

        SNMP_LOGD("Callback found with OID: %s\n", callback->OID->string().c_str());

        if(callback->type != requestVarBind.type){
            SNMP_LOGD("Callback Type mismatch: %d\n", callback->type);
            outResponseList.emplace_back(requestVarBind.oid, SNMP_ERROR_VERSION_CTRL_DEF(WRONG_TYPE, snmpVersion, BAD_VALUE));
            continue;
        }
        
        if(!callback->isSettable){
            SNMP_LOGD("Cannot set this object\n");
            outResponseList.emplace_back(requestVarBind.oid, SNMP_ERROR_VERSION_CTRL(READ_ONLY, snmpVersion));
            continue;
        }
        //NOTE: we could just use the same pointer as the reqwuest, but delete the value and add a new one. Will have to figure out what to do if it errors, do that later
        SNMP_ERROR_STATUS setError = ValueCallback::setValueForCallback(callback, requestVarBind.value);
        if(setError != NO_ERROR){
            SNMP_LOGD("Attempting to set Variable failed: %d\n", setError);
            outResponseList.emplace_back(callback->OID, SNMP_ERROR_VERSION_CTRL(setError, snmpVersion));
            continue;   
        }

        auto value = ValueCallback::getValueForCallback(callback);

        if(!value){
            SNMP_LOGD("Couldn't get value for callback\n");
            outResponseList.emplace_back(callback->OID, SNMP_ERROR_VERSION_CTRL(GEN_ERR, snmpVersion));
            continue;   
        }

        outResponseList.emplace_back(callback->OID, value);
    }
    return true; // we didn't fail in our job

}